

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::MenuItem(char *label,char *shortcut,bool *p_selected,bool enabled)

{
  bool bVar1;
  undefined1 local_41;
  bool enabled_local;
  bool *p_selected_local;
  char *shortcut_local;
  char *label_local;
  
  if (p_selected == (bool *)0x0) {
    local_41 = 0;
  }
  else {
    local_41 = *p_selected;
  }
  bVar1 = MenuItem(label,shortcut,(bool)(local_41 & 1),enabled);
  if (bVar1) {
    if (p_selected != (bool *)0x0) {
      *p_selected = (bool)((*p_selected ^ 0xffU) & 1);
    }
    label_local._7_1_ = true;
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::MenuItem(const char* label, const char* shortcut, bool* p_selected, bool enabled)
{
    if (MenuItem(label, shortcut, p_selected ? *p_selected : false, enabled))
    {
        if (p_selected)
            *p_selected = !*p_selected;
        return true;
    }
    return false;
}